

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O2

uint32_t __thiscall
icu_63::CollationWeights::incWeight(CollationWeights *this,uint32_t weight,int32_t length)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  
  iVar3 = length * -8 + 0x20;
  puVar4 = this->maxBytes + length;
  while( true ) {
    uVar2 = weight >> ((byte)iVar3 & 0x1f) & 0xff;
    if (uVar2 < *puVar4) break;
    weight = setWeightByte(weight,length,puVar4[-5]);
    length = length + -1;
    iVar3 = iVar3 + 8;
    puVar4 = puVar4 + -1;
  }
  uVar1 = setWeightByte(weight,length,uVar2 + 1);
  return uVar1;
}

Assistant:

uint32_t
CollationWeights::incWeight(uint32_t weight, int32_t length) const {
    for(;;) {
        uint32_t byte=getWeightByte(weight, length);
        if(byte<maxBytes[length]) {
            return setWeightByte(weight, length, byte+1);
        } else {
            // Roll over, set this byte to the minimum and increment the previous one.
            weight=setWeightByte(weight, length, minBytes[length]);
            --length;
            U_ASSERT(length > 0);
        }
    }
}